

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkPartitionNaive(Abc_Ntk_t *pNtk,int nPartSize)

{
  bool bVar1;
  int iVar2;
  Vec_Ptr_t *p;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Int_t *p_00;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar7 = pNtk->vCos->nSize;
  iVar2 = iVar7 / nPartSize;
  bVar1 = 0 < iVar7 % nPartSize;
  uVar6 = iVar2 + (uint)bVar1;
  p = (Vec_Ptr_t *)malloc(0x10);
  uVar5 = 8;
  if (6 < (iVar2 + (uint)bVar1) - 1) {
    uVar5 = uVar6;
  }
  p->nCap = uVar5;
  uVar9 = 0;
  if (uVar5 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)(int)uVar5 << 3);
  }
  p->pArray = ppvVar3;
  uVar8 = 0;
  if (0 < (int)uVar6) {
    uVar8 = (ulong)uVar6;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    pVVar4 = Vec_PtrAlloc(0);
    ppvVar3[uVar9] = pVVar4;
  }
  p->nSize = uVar6;
  for (iVar7 = 0; iVar7 < pNtk->vCos->nSize; iVar7 = iVar7 + 1) {
    Abc_NtkCo(pNtk,iVar7);
    p_00 = (Vec_Int_t *)Vec_PtrEntry(p,iVar7 / nPartSize);
    Vec_IntPush(p_00,iVar7);
  }
  return p;
}

Assistant:

Vec_Ptr_t * Abc_NtkPartitionNaive( Abc_Ntk_t * pNtk, int nPartSize )
{
    Vec_Ptr_t * vParts;
    Abc_Obj_t * pObj;
    int nParts, i;
    nParts = (Abc_NtkCoNum(pNtk) / nPartSize) + ((Abc_NtkCoNum(pNtk) % nPartSize) > 0);
    vParts = (Vec_Ptr_t *)Vec_VecStart( nParts );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_IntPush( (Vec_Int_t *)Vec_PtrEntry(vParts, i / nPartSize), i );
    return vParts;
}